

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferReader.hh
# Opt level: O2

bool __thiscall
avro::BufferReader::read<unsigned_char>(BufferReader *this,uchar *val,true_type *param_2)

{
  long lVar1;
  size_t __nbytes;
  
  lVar1 = *(long *)(this + 0x38);
  if (lVar1 != 0) {
    __nbytes = *(size_t *)(*(long *)(this + 0x10) + 0x20);
    if (*(long *)(this + 0x40) + __nbytes == *(long *)(*(long *)(this + 0x10) + 0x28)) {
      read(this,(int)val,(void *)0x1,__nbytes);
    }
    else {
      *val = *(uchar *)(__nbytes + *(long *)(this + 0x40));
      incrementChunk(this,1);
    }
  }
  return lVar1 != 0;
}

Assistant:

bool read(T &val, const boost::true_type&)
    {
        if(sizeof(T) > bytesRemaining_) {
            return false;
        }

        if (sizeof(T) <= chunkRemaining()) {
            val = *(reinterpret_cast<const T*> (addr()));
            incrementChunk(sizeof(T));
        }
        else {
            read(reinterpret_cast<data_type *>(&val), sizeof(T));
        }
        return true;
    }